

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_error.cpp
# Opt level: O0

string * __thiscall
pstore::json::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  allocator local_29;
  char *local_28;
  char *result;
  error_category *peStack_18;
  int error_local;
  error_category *this_local;
  
  local_28 = "unknown json::error_category error";
  switch(error) {
  case 0:
    local_28 = "none";
    break;
  case 1:
    local_28 = "expected array member";
    break;
  case 2:
    local_28 = "expected close quote";
    break;
  case 3:
    local_28 = "expected colon";
    break;
  case 4:
    local_28 = "expected digits";
    break;
  case 5:
    local_28 = "expected string";
    break;
  case 6:
    local_28 = "number out of range";
    break;
  case 7:
    local_28 = "expected object member";
    break;
  case 8:
    local_28 = "expected token";
    break;
  case 9:
    local_28 = "invalid escape character";
    break;
  case 10:
    local_28 = "invalid hexadecimal escape character";
    break;
  case 0xb:
    local_28 = "unrecognized token";
    break;
  case 0xc:
    local_28 = "unexpected extra input";
    break;
  case 0xd:
    local_28 = "bad UNICODE code point";
    break;
  case 0xe:
    local_28 = "objects are too deeply nested";
  }
  pcVar1 = local_28;
  result._4_4_ = error;
  peStack_18 = this;
  this_local = (error_category *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string pstore::json::error_category::message (int const error) const {
    auto * result = "unknown json::error_category error";
    switch (static_cast<error_code> (error)) {
    case error_code::none: result = "none"; break;
    case error_code::bad_unicode_code_point: result = "bad UNICODE code point"; break;
    case error_code::expected_array_member: result = "expected array member"; break;
    case error_code::expected_close_quote: result = "expected close quote"; break;
    case error_code::expected_colon: result = "expected colon"; break;
    case error_code::expected_digits: result = "expected digits"; break;
    case error_code::expected_object_member: result = "expected object member"; break;
    case error_code::expected_string: result = "expected string"; break;
    case error_code::expected_token: result = "expected token"; break;
    case error_code::invalid_escape_char: result = "invalid escape character"; break;
    case error_code::invalid_hex_char: result = "invalid hexadecimal escape character"; break;
    case error_code::number_out_of_range: result = "number out of range"; break;
    case error_code::unexpected_extra_input: result = "unexpected extra input"; break;
    case error_code::unrecognized_token: result = "unrecognized token"; break;
    case error_code::nesting_too_deep: result = "objects are too deeply nested"; break;
    }
    return result;
}